

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall
util::exception::exception<std::__cxx11::string&,char_const(&)[24]>
          (exception *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [24])

{
  char (*in_RCX) [24];
  string local_30;
  
  make_string<std::__cxx11::string&,char_const(&)[24]>
            (&local_30,(util *)args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,in_RCX);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__runtime_error_001dcc58;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}